

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

string * __thiscall lrit::TimeStampHeader::getTimeLong_abi_cxx11_(TimeStampHeader *this)

{
  pointer pvVar1;
  size_type __maxsize;
  tm *__tp;
  size_t sVar2;
  string *in_RDI;
  size_t len;
  timespec ts;
  array<char,_128UL> tsbuf;
  TimeStampHeader *in_stack_ffffffffffffff50;
  timespec local_a0;
  array<char,_128UL> local_90;
  
  local_a0 = getUnix(in_stack_ffffffffffffff50);
  pvVar1 = std::array<char,_128UL>::data((array<char,_128UL> *)0x14222a);
  __maxsize = std::array<char,_128UL>::size(&local_90);
  __tp = gmtime(&local_a0.tv_sec);
  sVar2 = strftime(pvVar1,__maxsize,"%Y-%m-%d %H:%M:%S",__tp);
  pvVar1 = std::array<char,_128UL>::data((array<char,_128UL> *)0x142270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pvVar1,sVar2,(allocator *)&stack0xffffffffffffff57);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  return in_RDI;
}

Assistant:

std::string TimeStampHeader::getTimeLong() const {
  std::array<char, 128> tsbuf;
  auto ts = getUnix();
  auto len = strftime(
    tsbuf.data(),
    tsbuf.size(),
    "%Y-%m-%d %H:%M:%S",
    gmtime(&ts.tv_sec));
  return std::string(tsbuf.data(), len);
}